

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_time_seek(OggVorbis_File *vf,double seconds)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  iVar2 = -0x83;
  if (1 < vf->ready_state) {
    if (vf->seekable == 0) {
      iVar2 = -0x8a;
    }
    else {
      dVar8 = 0.0;
      if (0.0 <= seconds) {
        uVar1 = vf->links;
        if ((int)uVar1 < 1) {
          uVar5 = 0;
          dVar7 = 0.0;
        }
        else {
          lVar4 = 8;
          uVar6 = 0;
          lVar3 = 0;
          dVar7 = dVar8;
          do {
            dVar8 = ov_time_total(vf,(int)uVar6);
            dVar8 = dVar8 + dVar7;
            if (seconds < dVar8) goto LAB_001a9cfc;
            lVar3 = lVar3 + *(long *)((long)vf->pcmlengths + lVar4);
            uVar6 = uVar6 + 1;
            lVar4 = lVar4 + 0x10;
            dVar7 = dVar8;
          } while (uVar1 != uVar6);
          uVar6 = (ulong)uVar1;
LAB_001a9cfc:
          uVar5 = (uint)uVar6;
          dVar8 = (double)lVar3;
        }
        if (uVar5 != uVar1) {
          iVar2 = ov_pcm_seek(vf,(long)((double)vf->vi[uVar5].rate * (seconds - dVar7) + dVar8));
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ov_time_seek(OggVorbis_File *vf,double seconds){
  /* translate time to PCM position and call ov_pcm_seek */

  int link=-1;
  ogg_int64_t pcm_total=0;
  double time_total=0.;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);
  if(seconds<0)return(OV_EINVAL);

  /* which bitstream section does this time offset occur in? */
  for(link=0;link<vf->links;link++){
    double addsec = ov_time_total(vf,link);
    if(seconds<time_total+addsec)break;
    time_total+=addsec;
    pcm_total+=vf->pcmlengths[link*2+1];
  }

  if(link==vf->links)return(OV_EINVAL);

  /* enough information to convert time offset to pcm offset */
  {
    ogg_int64_t target=pcm_total+(seconds-time_total)*vf->vi[link].rate;
    return(ov_pcm_seek(vf,target));
  }
}